

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O0

void av1_dist_wtd_convolve_y_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  uint uVar56;
  long lVar57;
  int in_ECX;
  int iVar58;
  int iVar59;
  int iVar60;
  uint uVar61;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ulong uVar62;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar69 [64];
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m128i res_hi_1_1;
  __m128i res_hi_0_1;
  __m128i res_lo_1_1;
  __m128i res_lo_0_1;
  __m128i res_1_5;
  __m128i res_0_5;
  __m256i res_8_3;
  __m256i round_result_hi_1;
  __m256i round_result_lo_1;
  __m256i comp_avg_res_hi_1;
  __m256i comp_avg_res_lo_1;
  __m256i data_ref_0_hi_1;
  __m256i data_ref_0_lo_1;
  __m256i res_hi_unsigned_1;
  __m256i res_hi_round_1;
  __m256i res_hi_1_round_1;
  __m256i res_hi_1_shift_1;
  __m256i res_hi_1_32b_1;
  __m256i res_hi_0_round_1;
  __m256i res_hi_0_shift_1;
  __m256i res_hi_0_32b_1;
  __m256i res_hi_2;
  __m128i res_1_4;
  __m128i res_0_4;
  __m128i res_1_3;
  __m128i res_0_3;
  __m256i res_8_2;
  __m256i round_result_1;
  __m256i comp_avg_res_1;
  __m256i data_ref_0_1;
  __m256i res_lo_unsigned_1;
  __m256i res_lo_round_1;
  __m256i res_lo_1_round_1;
  __m256i res_lo_1_shift_1;
  __m256i res_lo_1_32b_1;
  __m256i res_lo_0_round_1;
  __m256i res_lo_0_shift_1;
  __m256i res_lo_0_32b_1;
  __m256i res_lo_2;
  __m256i src_78a;
  __m256i src_67a;
  __m256i src7;
  int kk_1;
  __m256i src_a_1 [7];
  __m256i src_ab_1 [7];
  __m256i src6;
  uint8_t *data_1;
  uint8_t *src_ptr_1;
  int fo_vert_1;
  __m128i res_hi_1;
  __m128i res_hi_0;
  __m128i res_lo_1;
  __m128i res_lo_0;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_8_1;
  __m256i round_result_hi;
  __m256i round_result_lo;
  __m256i comp_avg_res_hi;
  __m256i comp_avg_res_lo;
  __m256i data_ref_0_hi;
  __m256i data_ref_0_lo;
  __m256i res_hi_unsigned;
  __m256i res_hi_round;
  __m256i res_hi_1_round;
  __m256i res_hi_1_shift;
  __m256i res_hi_1_32b;
  __m256i res_hi_0_round;
  __m256i res_hi_0_shift;
  __m256i res_hi_0_32b;
  __m256i res_hi;
  __m128i res_1_1;
  __m128i res_0_1;
  __m128i res_1;
  __m128i res_0;
  __m256i res_8;
  __m256i round_result;
  __m256i comp_avg_res;
  __m256i data_ref_0;
  __m256i res_lo_unsigned;
  __m256i res_lo_round;
  __m256i res_lo_1_round;
  __m256i res_lo_1_shift;
  __m256i res_lo_1_32b;
  __m256i res_lo_0_round;
  __m256i res_lo_0_shift;
  __m256i res_lo_0_32b;
  __m256i res_lo;
  __m256i src_56a;
  __m256i src_45a;
  __m256i src5;
  int kk;
  __m256i src_a [5];
  __m256i src_ab [4];
  __m256i src4;
  uint8_t *data;
  uint8_t *src_ptr;
  int fo_vert;
  __m256i s [8];
  __m256i coeffs [4];
  __m256i zero;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const_2;
  __m256i offset_const_1;
  int offset_1;
  __m256i offset_const;
  int offset;
  int offset_0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m256i wt;
  __m128i round_shift;
  __m256i round_const;
  int left_shift;
  int is_vert_4tap;
  int j;
  int i;
  int bd;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  undefined8 *in_stack_ffffffffffffd938;
  __m256i *in_stack_ffffffffffffd940;
  int iVar70;
  undefined4 in_stack_ffffffffffffd950;
  undefined4 uVar71;
  InterpFilterParams *in_stack_ffffffffffffd960;
  ConvolveParams *in_stack_ffffffffffffd968;
  __m256i *in_stack_ffffffffffffd970;
  undefined8 local_2680;
  undefined8 uStack_2678;
  __m256i *in_stack_ffffffffffffd9a8;
  __m256i *in_stack_ffffffffffffd9b0;
  __m256i *local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  __m256i *palStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  int use_dist_wtd_comp_avg_00;
  __m256i *wt_00;
  undefined1 local_2600 [32];
  undefined8 uStack_25e8;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  int local_21e4;
  undefined1 local_21e0 [32];
  undefined8 auStack_21c0 [2];
  undefined1 auStack_21b0 [144];
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined1 (*local_1ff8) [16];
  long local_1ff0;
  int local_1fe4;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 local_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 local_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 local_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f80 [32];
  undefined1 local_1f60 [32];
  undefined1 local_1f40 [32];
  undefined1 local_1f20 [32];
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [32];
  undefined1 local_1ec0 [32];
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [32];
  undefined1 local_1e20 [32];
  undefined1 local_1e00 [32];
  undefined1 local_1de0 [32];
  undefined1 local_1dc0 [32];
  undefined1 local_1da0 [32];
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 local_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 local_1d50;
  undefined8 uStack_1d48;
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined1 local_1c20 [32];
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined1 auStack_1b50 [16];
  int local_1b24;
  undefined1 local_1b20 [32];
  undefined8 auStack_1b00 [2];
  undefined1 auStack_1af0 [80];
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined1 (*local_19d8) [16];
  long local_19d0;
  undefined4 local_19c4;
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined1 local_1920 [32];
  undefined1 local_1900 [32];
  undefined1 local_18e0 [32];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  longlong local_1820;
  longlong lStack_1818;
  longlong lStack_1810;
  longlong lStack_1808;
  int local_17e4;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined4 local_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  uint local_1750;
  int local_174c;
  undefined4 local_1748;
  int local_1744;
  ulong local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  ulong local_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  uint local_16d0;
  int local_16cc;
  int local_16c8;
  int local_16c4;
  undefined4 local_16c0;
  uint local_16bc;
  long local_16b8;
  int local_16ac;
  int local_16a8;
  int local_16a4;
  long local_16a0;
  int local_1694;
  long local_1690;
  ushort local_1688;
  ushort local_1686;
  undefined2 local_1684;
  ushort local_1682;
  undefined1 local_1680 [16];
  uint local_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  __m256i *local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  __m256i *palStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 *local_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 *local_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 *local_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 *local_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 *local_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 *local_10a8;
  undefined8 *local_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 *local_1068;
  undefined8 local_1060;
  __m256i *palStack_1058;
  undefined8 *local_1048;
  __m256i *local_1040;
  undefined8 uStack_1038;
  undefined8 *local_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 *local_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 *local_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 *local_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 *local_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 *local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 *local_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 *local_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 *local_ef0;
  uint local_ee4;
  undefined1 local_ee0 [32];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined1 (*local_e40) [16];
  undefined1 (*local_e38) [16];
  undefined1 (*local_e30) [16];
  undefined1 (*local_e28) [16];
  undefined1 (*local_e20) [16];
  undefined1 (*local_e18) [16];
  undefined1 (*local_e10) [16];
  undefined1 (*local_e08) [16];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  uint local_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  uint local_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  uint local_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  uint local_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  uint local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  uint local_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  uint local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  ulong local_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  ulong local_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  ulong local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  ulong local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  ulong local_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  ulong local_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  ulong local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  ulong local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ushort local_160;
  ushort local_15e;
  ushort local_15c;
  ushort local_15a;
  ushort local_158;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  ushort local_150;
  ushort local_14e;
  ushort local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined2 local_120;
  undefined2 local_11e;
  undefined2 local_11c;
  undefined2 local_11a;
  undefined2 local_118;
  undefined2 local_116;
  undefined2 local_114;
  undefined2 local_112;
  undefined2 local_110;
  undefined2 local_10e;
  undefined2 local_10c;
  undefined2 local_10a;
  undefined2 local_108;
  undefined2 local_106;
  undefined2 local_104;
  undefined2 local_102;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ushort local_a0;
  ushort local_9e;
  ushort local_9c;
  ushort local_9a;
  ushort local_98;
  ushort local_96;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  ushort local_8a;
  ushort local_88;
  ushort local_86;
  ushort local_84;
  ushort local_82;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  __m256i *res_unsigned;
  __m256i *data_ref_0_00;
  
  local_16b8 = *(long *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 8);
  local_16bc = *(uint *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x10);
  local_16c0 = 8;
  local_16cc = 0;
  local_16d0 = 8 - *(int *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x14);
  iVar70 = 1;
  uVar56 = (1 << (*(byte *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18) & 0x1f)) >> 1;
  auVar1 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar1 = vpinsrd_avx(auVar1,uVar56,2);
  local_80 = vpinsrd_avx(auVar1,uVar56,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar1 = vpinsrd_avx(auVar1,uVar56,2);
  auStack_70 = vpinsrd_avx(auVar1,uVar56,3);
  local_1700 = local_80._0_8_;
  uStack_16f8 = local_80._8_8_;
  uStack_16f0 = auStack_70._0_8_;
  uStack_16e8 = auStack_70._8_8_;
  local_1664 = *(uint *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18);
  local_1680._4_4_ = 0;
  local_1680._0_4_ = local_1664;
  local_1680._8_8_ = 0;
  uVar67 = 0;
  uVar68 = 0;
  local_1710 = local_1680._0_8_;
  uStack_1708 = 0;
  uVar62 = local_1680._0_8_;
  uVar66 = local_1680._8_8_;
  local_16ac = in_R9D;
  local_16a8 = in_R8D;
  local_16a4 = in_ECX;
  local_16a0 = in_RDX;
  local_1694 = in_ESI;
  local_1690 = in_RDI;
  local_1680 = ZEXT416(local_1664);
  local_ee4 = uVar56;
  local_50 = uVar56;
  local_4c = uVar56;
  local_48 = uVar56;
  local_44 = uVar56;
  local_40 = uVar56;
  local_3c = uVar56;
  local_38 = uVar56;
  local_34 = uVar56;
  unpack_weights_avx2(in_stack_ffffffffffffd968);
  local_1744 = *(int *)CONCAT44(in_stack_0000001c,subpel_y_qn);
  local_1748 = *(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x24);
  local_174c = 0x16 - (*(int *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x14) +
                      *(int *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18));
  uVar71 = CONCAT13((byte)local_174c,(int3)in_stack_ffffffffffffd950);
  iVar60 = iVar70 << ((byte)local_174c & 0x1f);
  local_1750 = iVar60 + (iVar70 << ((byte)local_174c - 1 & 0x1f));
  local_1682 = (ushort)local_1750;
  local_142 = (ushort)local_1750;
  local_144 = (ushort)local_1750;
  local_146 = (ushort)local_1750;
  local_148 = (ushort)local_1750;
  local_14a = (ushort)local_1750;
  local_14c = (ushort)local_1750;
  local_14e = (ushort)local_1750;
  local_150 = (ushort)local_1750;
  local_152 = (ushort)local_1750;
  local_154 = (ushort)local_1750;
  local_156 = (ushort)local_1750;
  local_158 = (ushort)local_1750;
  local_15a = (ushort)local_1750;
  local_15c = (ushort)local_1750;
  local_15e = (ushort)local_1750;
  local_160 = (ushort)local_1750;
  auVar1 = vpinsrw_avx(ZEXT216((ushort)local_1750),local_1750 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,6);
  local_180 = vpinsrw_avx(auVar1,local_1750 & 0xffff,7);
  auVar1 = vpinsrw_avx(ZEXT216((ushort)local_1750),local_1750 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,local_1750 & 0xffff,6);
  auStack_170 = vpinsrw_avx(auVar1,local_1750 & 0xffff,7);
  local_1780 = local_180._0_8_;
  uStack_1778 = local_180._8_8_;
  uStack_1770 = auStack_170._0_8_;
  uStack_1768 = auStack_170._8_8_;
  local_1784 = 0x2000;
  local_1684 = 0x2000;
  local_102 = 0x2000;
  local_104 = 0x2000;
  local_106 = 0x2000;
  local_108 = 0x2000;
  local_10a = 0x2000;
  local_10c = 0x2000;
  local_10e = 0x2000;
  local_110 = 0x2000;
  local_112 = 0x2000;
  local_114 = 0x2000;
  local_116 = 0x2000;
  local_118 = 0x2000;
  local_11a = 0x2000;
  local_11c = 0x2000;
  local_11e = 0x2000;
  local_120 = 0x2000;
  auVar1 = vpinsrw_avx(ZEXT216(0x2000),0x2000,1);
  auVar1 = vpinsrw_avx(auVar1,0x2000,2);
  auVar1 = vpinsrw_avx(auVar1,0x2000,3);
  auVar1 = vpinsrw_avx(auVar1,0x2000,4);
  auVar1 = vpinsrw_avx(auVar1,0x2000,5);
  auVar1 = vpinsrw_avx(auVar1,0x2000,6);
  local_140 = vpinsrw_avx(auVar1,0x2000,7);
  auVar1 = vpinsrw_avx(ZEXT216(0x2000),0x2000,1);
  auVar1 = vpinsrw_avx(auVar1,0x2000,2);
  auVar1 = vpinsrw_avx(auVar1,0x2000,3);
  auVar1 = vpinsrw_avx(auVar1,0x2000,4);
  auVar1 = vpinsrw_avx(auVar1,0x2000,5);
  auVar1 = vpinsrw_avx(auVar1,0x2000,6);
  auStack_130 = vpinsrw_avx(auVar1,0x2000,7);
  local_17c0 = local_140._0_8_;
  uStack_17b8 = local_140._8_8_;
  uStack_17b0 = auStack_130._0_8_;
  uStack_17a8 = auStack_130._8_8_;
  uVar61 = iVar70 << ((byte)local_174c & 0x1f);
  local_1686 = (ushort)uVar61;
  auVar1 = vpinsrw_avx(ZEXT216(local_1686),uVar61 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,6);
  local_100 = vpinsrw_avx(auVar1,uVar61 & 0xffff,7);
  auVar1 = vpinsrw_avx(ZEXT216(local_1686),uVar61 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,6);
  auStack_f0 = vpinsrw_avx(auVar1,uVar61 & 0xffff,7);
  local_17e0 = local_100._0_8_;
  uStack_17d8 = local_100._8_8_;
  uStack_17d0 = auStack_f0._0_8_;
  uStack_17c8 = auStack_f0._8_8_;
  local_17e4 = 0xe - (*(int *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x14) +
                     *(int *)(CONCAT44(in_stack_0000001c,subpel_y_qn) + 0x18));
  uVar61 = (uint)(iVar70 << ((byte)local_17e4 & 0x1f)) >> 1;
  local_1688 = (ushort)uVar61;
  auVar1 = vpinsrw_avx(ZEXT216(local_1688),uVar61 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,6);
  local_c0 = vpinsrw_avx(auVar1,uVar61 & 0xffff,7);
  auVar1 = vpinsrw_avx(ZEXT216(local_1688),uVar61 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar61 & 0xffff,6);
  auStack_b0 = vpinsrw_avx(auVar1,uVar61 & 0xffff,7);
  local_1820 = local_c0._0_8_;
  lStack_1818 = local_c0._8_8_;
  lStack_1810 = auStack_b0._0_8_;
  lStack_1808 = auStack_b0._8_8_;
  local_ee0._8_8_ = SUB328(ZEXT832(0),4);
  local_1840 = 0;
  uStack_1838 = local_ee0._8_8_;
  uStack_1830 = 0;
  uStack_1828 = 0;
  local_1740 = uVar62;
  uStack_1738 = uVar66;
  uStack_1730 = uVar67;
  uStack_1728 = uVar68;
  local_ee0 = ZEXT832(0) << 0x20;
  local_e0 = local_1686;
  local_de = local_1686;
  local_dc = local_1686;
  local_da = local_1686;
  local_d8 = local_1686;
  local_d6 = local_1686;
  local_d4 = local_1686;
  local_d2 = local_1686;
  local_d0 = local_1686;
  local_ce = local_1686;
  local_cc = local_1686;
  local_ca = local_1686;
  local_c8 = local_1686;
  local_c6 = local_1686;
  local_c4 = local_1686;
  local_c2 = local_1686;
  local_a0 = local_1688;
  local_9e = local_1688;
  local_9c = local_1688;
  local_9a = local_1688;
  local_98 = local_1688;
  local_96 = local_1688;
  local_94 = local_1688;
  local_92 = local_1688;
  local_90 = local_1688;
  local_8e = local_1688;
  local_8c = local_1688;
  local_8a = local_1688;
  local_88 = local_1688;
  local_86 = local_1688;
  local_84 = local_1688;
  local_82 = local_1688;
  prepare_coeffs_lowbd
            (in_stack_ffffffffffffd960,CONCAT22(local_1688,local_1686),
             (__m256i *)CONCAT44(iVar60,uVar71));
  local_1640 = local_18c0;
  uStack_1638 = uStack_18b8;
  uStack_1630 = uStack_18b0;
  uStack_1628 = uStack_18a8;
  local_1660 = local_1860;
  uStack_1658 = uStack_1858;
  uStack_1650 = uStack_1850;
  uStack_1648 = uStack_1848;
  auVar1._8_8_ = uStack_1858;
  auVar1._0_8_ = local_1860;
  auVar11._8_8_ = uStack_18b8;
  auVar11._0_8_ = local_18c0;
  auVar1 = vpor_avx(auVar11,auVar1);
  if (auVar1._0_4_ == 0) {
    local_16cc = 1;
  }
  if (local_16cc == 0) {
    local_1fe4 = *(ushort *)(in_stack_00000008 + 8) / 2 - 1;
    local_1ff0 = local_1690 - local_1fe4 * local_1694;
    palStack_2628 = in_stack_ffffffffffffd9a8;
    local_2640 = in_stack_ffffffffffffd9b0;
    for (local_16c8 = 0; local_16c8 < local_16a8; local_16c8 = local_16c8 + 0x10) {
      local_1ff8 = (undefined1 (*) [16])(local_1ff0 + local_16c8);
      local_e28 = local_1ff8;
      local_e90 = *(undefined8 *)*local_1ff8;
      uStack_e88 = *(undefined8 *)(*local_1ff8 + 8);
      auVar69 = ZEXT1664(*local_1ff8);
      local_21e0 = ZEXT1632(*local_1ff8);
      for (local_21e4 = 0; local_21e4 < 6; local_21e4 = local_21e4 + 1) {
        local_1ff8 = (undefined1 (*) [16])(*local_1ff8 + local_1694);
        local_e30 = local_1ff8;
        local_ea0 = *(undefined8 *)*local_1ff8;
        uStack_e98 = *(undefined8 *)(*local_1ff8 + 8);
        lVar57 = (long)local_21e4 * 0x20;
        *(undefined1 (*) [16])(auStack_21b0 + lVar57) = auVar69._0_16_;
        auStack_21c0[(long)local_21e4 * 4] = local_ea0;
        *(undefined8 *)(auStack_21b0 + lVar57 + -8) = uStack_e98;
        auVar69 = ZEXT3264(*(undefined1 (*) [32])(auStack_21c0 + (long)local_21e4 * 4));
        auVar63 = vperm2i128_avx2(*(undefined1 (*) [32])(local_21e0 + (long)local_21e4 * 0x20),
                                  *(undefined1 (*) [32])(auStack_21c0 + (long)local_21e4 * 4),0x20);
        *(undefined1 (*) [32])(&local_2100 + (long)local_21e4 * 4) = auVar63;
      }
      local_2020 = local_2120;
      uStack_2018 = uStack_2118;
      uStack_2010 = uStack_2110;
      uStack_2008 = uStack_2108;
      local_d20 = local_2100;
      uStack_d18 = uStack_20f8;
      uStack_d10 = uStack_20f0;
      uStack_d08 = uStack_20e8;
      local_d40 = local_20e0;
      uStack_d38 = uStack_20d8;
      uStack_d30 = uStack_20d0;
      uStack_d28 = uStack_20c8;
      auVar19._8_8_ = uStack_20f8;
      auVar19._0_8_ = local_2100;
      auVar19._16_8_ = uStack_20f0;
      auVar19._24_8_ = uStack_20e8;
      auVar18._8_8_ = uStack_20d8;
      auVar18._0_8_ = local_20e0;
      auVar18._16_8_ = uStack_20d0;
      auVar18._24_8_ = uStack_20c8;
      local_19c0 = vpunpcklbw_avx2(auVar19,auVar18);
      local_d60 = local_20c0;
      uStack_d58 = uStack_20b8;
      uStack_d50 = uStack_20b0;
      uStack_d48 = uStack_20a8;
      local_d80 = local_20a0;
      uStack_d78 = uStack_2098;
      uStack_d70 = uStack_2090;
      uStack_d68 = uStack_2088;
      auVar17._8_8_ = uStack_20b8;
      auVar17._0_8_ = local_20c0;
      auVar17._16_8_ = uStack_20b0;
      auVar17._24_8_ = uStack_20a8;
      auVar16._8_8_ = uStack_2098;
      auVar16._0_8_ = local_20a0;
      auVar16._16_8_ = uStack_2090;
      auVar16._24_8_ = uStack_2088;
      local_19a0 = vpunpcklbw_avx2(auVar17,auVar16);
      local_da0 = local_2080;
      uStack_d98 = uStack_2078;
      uStack_d90 = uStack_2070;
      uStack_d88 = uStack_2068;
      local_dc0 = local_2060;
      uStack_db8 = uStack_2058;
      uStack_db0 = uStack_2050;
      uStack_da8 = uStack_2048;
      auVar2._8_8_ = uStack_2078;
      auVar2._0_8_ = local_2080;
      auVar2._16_8_ = uStack_2070;
      auVar2._24_8_ = uStack_2068;
      auVar65._8_8_ = uStack_2058;
      auVar65._0_8_ = local_2060;
      auVar65._16_8_ = uStack_2050;
      auVar65._24_8_ = uStack_2048;
      local_1980 = vpunpcklbw_avx2(auVar2,auVar65);
      local_b60 = local_2100;
      uStack_b58 = uStack_20f8;
      uStack_b50 = uStack_20f0;
      uStack_b48 = uStack_20e8;
      local_b80 = local_20e0;
      uStack_b78 = uStack_20d8;
      uStack_b70 = uStack_20d0;
      uStack_b68 = uStack_20c8;
      auVar28._8_8_ = uStack_20f8;
      auVar28._0_8_ = local_2100;
      auVar28._16_8_ = uStack_20f0;
      auVar28._24_8_ = uStack_20e8;
      auVar27._8_8_ = uStack_20d8;
      auVar27._0_8_ = local_20e0;
      auVar27._16_8_ = uStack_20d0;
      auVar27._24_8_ = uStack_20c8;
      local_1940 = vpunpckhbw_avx2(auVar28,auVar27);
      local_ba0 = local_20c0;
      uStack_b98 = uStack_20b8;
      uStack_b90 = uStack_20b0;
      uStack_b88 = uStack_20a8;
      local_bc0 = local_20a0;
      uStack_bb8 = uStack_2098;
      uStack_bb0 = uStack_2090;
      uStack_ba8 = uStack_2088;
      auVar26._8_8_ = uStack_20b8;
      auVar26._0_8_ = local_20c0;
      auVar26._16_8_ = uStack_20b0;
      auVar26._24_8_ = uStack_20a8;
      auVar25._8_8_ = uStack_2098;
      auVar25._0_8_ = local_20a0;
      auVar25._16_8_ = uStack_2090;
      auVar25._24_8_ = uStack_2088;
      local_1920 = vpunpckhbw_avx2(auVar26,auVar25);
      local_be0 = local_2080;
      uStack_bd8 = uStack_2078;
      uStack_bd0 = uStack_2070;
      uStack_bc8 = uStack_2068;
      local_c00 = local_2060;
      uStack_bf8 = uStack_2058;
      uStack_bf0 = uStack_2050;
      uStack_be8 = uStack_2048;
      auVar24._8_8_ = uStack_2078;
      auVar24._0_8_ = local_2080;
      auVar24._16_8_ = uStack_2070;
      auVar24._24_8_ = uStack_2068;
      auVar63._8_8_ = uStack_2058;
      auVar63._0_8_ = local_2060;
      auVar63._16_8_ = uStack_2050;
      auVar63._24_8_ = uStack_2048;
      local_1900 = vpunpckhbw_avx2(auVar24,auVar63);
      for (local_16c4 = 0; local_16c4 < local_16ac; local_16c4 = local_16c4 + 2) {
        local_1ff8 = (undefined1 (*) [16])
                     (local_1ff0 + ((local_16c4 + 7) * local_1694 + local_16c8));
        local_eb0 = *(undefined8 *)*local_1ff8;
        uStack_ea8 = *(undefined8 *)(*local_1ff8 + 8);
        auVar5._8_8_ = uStack_2018;
        auVar5._0_8_ = local_2020;
        auVar5._16_8_ = uStack_2010;
        auVar5._24_8_ = uStack_2008;
        auVar3._16_16_ = auVar63._0_16_;
        auVar3._0_16_ = *local_1ff8;
        auVar65 = vperm2i128_avx2(auVar5,auVar3,0x20);
        local_e40 = (undefined1 (*) [16])(*local_1ff8 + local_1694);
        local_2020 = *(undefined8 *)*local_e40;
        uStack_2018 = *(undefined8 *)(*local_e40 + 8);
        uStack_2010 = auVar63._0_8_;
        uStack_2008 = auVar63._8_8_;
        auVar4._16_16_ = auVar63._0_16_;
        auVar4._0_16_ = *local_1ff8;
        auVar6._16_8_ = uStack_2010;
        auVar6._0_16_ = *local_e40;
        auVar6._24_8_ = uStack_2008;
        auVar63 = vperm2i128_avx2(auVar4,auVar6,0x20);
        local_2240 = auVar65._0_8_;
        uStack_2238 = auVar65._8_8_;
        uStack_2230 = auVar65._16_8_;
        uStack_2228 = auVar65._24_8_;
        local_2260 = auVar63._0_8_;
        uStack_2258 = auVar63._8_8_;
        uStack_2250 = auVar63._16_8_;
        uStack_2248 = auVar63._24_8_;
        local_de0 = local_2240;
        uStack_dd8 = uStack_2238;
        uStack_dd0 = uStack_2230;
        uStack_dc8 = uStack_2228;
        local_e00 = local_2260;
        uStack_df8 = uStack_2258;
        uStack_df0 = uStack_2250;
        uStack_de8 = uStack_2248;
        local_1960 = vpunpcklbw_avx2(auVar65,auVar63);
        local_c20 = local_2240;
        uStack_c18 = uStack_2238;
        uStack_c10 = uStack_2230;
        uStack_c08 = uStack_2228;
        local_c40 = local_2260;
        uStack_c38 = uStack_2258;
        uStack_c30 = uStack_2250;
        uStack_c28 = uStack_2248;
        auVar63 = vpunpckhbw_avx2(auVar65,auVar63);
        local_18e0 = auVar63;
        local_ec0 = local_2020;
        uStack_eb8 = uStack_2018;
        local_e38 = local_1ff8;
        convolve_lowbd(local_2640,palStack_2628);
        local_2280 = auVar63._0_8_;
        uStack_2278 = auVar63._8_8_;
        uStack_2270 = auVar63._16_8_;
        uStack_2268 = auVar63._24_8_;
        local_1540 = local_2280;
        uStack_1538 = uStack_2278;
        uStack_1530 = uStack_2270;
        uStack_1528 = uStack_2268;
        local_1560 = local_17c0;
        uStack_1558 = uStack_17b8;
        uStack_1550 = uStack_17b0;
        uStack_1548 = uStack_17a8;
        auVar13._8_8_ = uStack_17b8;
        auVar13._0_8_ = local_17c0;
        auVar13._16_8_ = uStack_17b0;
        auVar13._24_8_ = uStack_17a8;
        auVar63 = vpaddw_avx2(auVar63,auVar13);
        local_2280 = auVar63._0_8_;
        uStack_2278 = auVar63._8_8_;
        uStack_2270 = auVar63._16_8_;
        uStack_2268 = auVar63._24_8_;
        local_a20 = local_2280;
        uStack_a18 = uStack_2278;
        uStack_a10 = uStack_2270;
        uStack_a08 = uStack_2268;
        local_a40 = local_1840;
        uStack_a38 = uStack_1838;
        uStack_a30 = uStack_1830;
        uStack_a28 = uStack_1828;
        auVar33._8_8_ = uStack_1838;
        auVar33._0_8_ = local_1840;
        auVar33._16_8_ = uStack_1830;
        auVar33._24_8_ = uStack_1828;
        auVar65 = vpunpcklwd_avx2(auVar63,auVar33);
        local_22a0 = auVar65._0_8_;
        uStack_2298 = auVar65._8_8_;
        uStack_2290 = auVar65._16_8_;
        uStack_2288 = auVar65._24_8_;
        local_8a0 = local_22a0;
        uStack_898 = uStack_2298;
        uStack_890 = uStack_2290;
        uStack_888 = uStack_2288;
        local_8a4 = local_16d0;
        auVar65 = vpslld_avx2(auVar65,ZEXT416(local_16d0));
        local_22c0 = auVar65._0_8_;
        uStack_22b8 = auVar65._8_8_;
        uStack_22b0 = auVar65._16_8_;
        uStack_22a8 = auVar65._24_8_;
        local_4a0 = local_22c0;
        uStack_498 = uStack_22b8;
        uStack_490 = uStack_22b0;
        uStack_488 = uStack_22a8;
        local_4c0 = local_1700;
        uStack_4b8 = uStack_16f8;
        uStack_4b0 = uStack_16f0;
        uStack_4a8 = uStack_16e8;
        auVar47._8_8_ = uStack_16f8;
        auVar47._0_8_ = local_1700;
        auVar47._16_8_ = uStack_16f0;
        auVar47._24_8_ = uStack_16e8;
        local_6a0 = vpaddd_avx2(auVar65,auVar47);
        local_6b0 = local_1710;
        uStack_6a8 = uStack_1708;
        auVar39._8_8_ = uStack_1708;
        auVar39._0_8_ = local_1710;
        auVar65 = vpsrad_avx2(local_6a0,auVar39);
        local_320 = local_2280;
        uStack_318 = uStack_2278;
        uStack_310 = uStack_2270;
        uStack_308 = uStack_2268;
        local_340 = local_1840;
        uStack_338 = uStack_1838;
        uStack_330 = uStack_1830;
        uStack_328 = uStack_1828;
        auVar53._8_8_ = uStack_1838;
        auVar53._0_8_ = local_1840;
        auVar53._16_8_ = uStack_1830;
        auVar53._24_8_ = uStack_1828;
        auVar63 = vpunpckhwd_avx2(auVar63,auVar53);
        local_2300 = auVar63._0_8_;
        uStack_22f8 = auVar63._8_8_;
        uStack_22f0 = auVar63._16_8_;
        uStack_22e8 = auVar63._24_8_;
        local_8e0 = local_2300;
        uStack_8d8 = uStack_22f8;
        uStack_8d0 = uStack_22f0;
        uStack_8c8 = uStack_22e8;
        local_8e4 = local_16d0;
        auVar63 = vpslld_avx2(auVar63,ZEXT416(local_16d0));
        local_2320 = auVar63._0_8_;
        uStack_2318 = auVar63._8_8_;
        uStack_2310 = auVar63._16_8_;
        uStack_2308 = auVar63._24_8_;
        local_4e0 = local_2320;
        uStack_4d8 = uStack_2318;
        uStack_4d0 = uStack_2310;
        uStack_4c8 = uStack_2308;
        local_500 = local_1700;
        uStack_4f8 = uStack_16f8;
        uStack_4f0 = uStack_16f0;
        uStack_4e8 = uStack_16e8;
        auVar46._8_8_ = uStack_16f8;
        auVar46._0_8_ = local_1700;
        auVar46._16_8_ = uStack_16f0;
        auVar46._24_8_ = uStack_16e8;
        local_6e0 = vpaddd_avx2(auVar63,auVar46);
        local_6f0 = local_1710;
        uStack_6e8 = uStack_1708;
        auVar38._8_8_ = uStack_1708;
        auVar38._0_8_ = local_1710;
        auVar63 = vpsrad_avx2(local_6e0,auVar38);
        local_22e0 = auVar65._0_8_;
        uStack_22d8 = auVar65._8_8_;
        uStack_22d0 = auVar65._16_8_;
        uStack_22c8 = auVar65._24_8_;
        local_2340 = auVar63._0_8_;
        uStack_2338 = auVar63._8_8_;
        uStack_2330 = auVar63._16_8_;
        uStack_2328 = auVar63._24_8_;
        local_220 = local_22e0;
        uStack_218 = uStack_22d8;
        uStack_210 = uStack_22d0;
        uStack_208 = uStack_22c8;
        local_240 = local_2340;
        uStack_238 = uStack_2338;
        uStack_230 = uStack_2330;
        uStack_228 = uStack_2328;
        auVar65 = vpackssdw_avx2(auVar65,auVar63);
        local_2360 = auVar65._0_8_;
        uStack_2358 = auVar65._8_8_;
        uStack_2350 = auVar65._16_8_;
        uStack_2348 = auVar65._24_8_;
        local_1580 = local_2360;
        uStack_1578 = uStack_2358;
        uStack_1570 = uStack_2350;
        uStack_1568 = uStack_2348;
        local_15a0 = local_17e0;
        uStack_1598 = uStack_17d8;
        uStack_1590 = uStack_17d0;
        uStack_1588 = uStack_17c8;
        auVar63._8_8_ = uStack_17d8;
        auVar63._0_8_ = local_17e0;
        auVar63._16_8_ = uStack_17d0;
        auVar63._24_8_ = uStack_17c8;
        auVar65 = vpaddw_avx2(auVar65,auVar63);
        iVar58 = (int)((ulong)in_stack_ffffffffffffd938 >> 0x20);
        local_2380 = auVar65._0_8_;
        uStack_2378 = auVar65._8_8_;
        uStack_2370 = auVar65._16_8_;
        uStack_2368 = auVar65._24_8_;
        if (local_16a8 - local_16c8 < 0x10) {
          if (local_1744 == 0) {
            local_12c0 = local_2380;
            uStack_12b8 = uStack_2378;
            uStack_12b0 = uStack_2370;
            uStack_12a8 = uStack_2368;
            local_fe8 = (undefined8 *)
                        (local_16b8 + (long)(int)(local_16c4 * local_16bc + local_16c8) * 2);
            local_1000 = local_2380;
            uStack_ff8 = uStack_2378;
            *local_fe8 = local_2380;
            local_fe8[1] = uStack_2378;
            local_1008 = (undefined8 *)
                         (local_16b8 +
                         (long)(int)(local_16c4 * local_16bc + local_16c8 + local_16bc) * 2);
            local_1020 = uStack_2370;
            uStack_1018 = uStack_2368;
            *local_1008 = uStack_2370;
            local_1008[1] = uStack_2368;
          }
          else {
            iVar59 = local_16c4 * local_16bc + local_16c8;
            auVar63 = auVar65;
            load_line2_avx2((__m256i *)(local_16b8 + (long)iVar59 * 2),
                            (void *)(local_16b8 + (long)(int)(iVar59 + local_16bc) * 2),
                            (void *)(ulong)local_16bc);
            comp_avg(data_ref_0_00,res_unsigned,wt_00,use_dist_wtd_comp_avg_00);
            convolve_rounding((__m256i *)CONCAT44(iVar60,uVar71),(__m256i *)CONCAT44(iVar70,uVar56),
                              in_stack_ffffffffffffd940,iVar58);
            local_23e0 = auVar63._0_8_;
            uStack_23d8 = auVar63._8_8_;
            uStack_23d0 = auVar63._16_8_;
            uStack_23c8 = auVar63._24_8_;
            local_13c0 = local_23e0;
            uStack_13b8 = uStack_23d8;
            uStack_13b0 = uStack_23d0;
            uStack_13a8 = uStack_23c8;
            local_13e0 = local_23e0;
            uStack_13d8 = uStack_23d8;
            uStack_13d0 = uStack_23d0;
            uStack_13c8 = uStack_23c8;
            auVar65 = vpackuswb_avx2(auVar63,auVar63);
            local_2400 = auVar65._0_8_;
            uStack_23f8 = auVar65._8_8_;
            uStack_23f0 = auVar65._16_8_;
            uStack_23e8 = auVar65._24_8_;
            local_12a0 = local_2400;
            uStack_1298 = uStack_23f8;
            uStack_1290 = uStack_23f0;
            uStack_1288 = uStack_23e8;
            if (local_16a8 - local_16c8 < 5) {
              local_1130 = local_2400;
              uStack_1128 = uStack_23f8;
              local_1140 = local_2400;
              uVar67 = local_1140;
              uStack_1138 = uStack_23f8;
              local_1140._0_4_ = auVar65._0_4_;
              *(undefined4 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8)) =
                   (undefined4)local_1140;
              local_1150 = uStack_23f0;
              uStack_1148 = uStack_23e8;
              local_1160 = uStack_23f0;
              uVar66 = local_1160;
              uStack_1158 = uStack_23e8;
              local_1160._0_4_ = auVar65._16_4_;
              *(undefined4 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8 + local_16a4)) =
                   (undefined4)local_1160;
              local_1160 = uVar66;
              local_1140 = uVar67;
            }
            else {
              local_11a8 = (undefined8 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8));
              local_11c0 = local_2400;
              uStack_11b8 = uStack_23f8;
              *local_11a8 = local_2400;
              local_11c8 = (undefined8 *)
                           (local_16a0 + (local_16c4 * local_16a4 + local_16c8 + local_16a4));
              local_11e0 = uStack_23f0;
              uStack_11d8 = uStack_23e8;
              *local_11c8 = uStack_23f0;
            }
          }
        }
        else {
          convolve_lowbd(local_2640,palStack_2628);
          local_2460 = auVar65._0_8_;
          uStack_2458 = auVar65._8_8_;
          uStack_2450 = auVar65._16_8_;
          uStack_2448 = auVar65._24_8_;
          local_15c0 = local_2460;
          uStack_15b8 = uStack_2458;
          uStack_15b0 = uStack_2450;
          uStack_15a8 = uStack_2448;
          local_15e0 = local_17c0;
          uStack_15d8 = uStack_17b8;
          uStack_15d0 = uStack_17b0;
          uStack_15c8 = uStack_17a8;
          auVar12._8_8_ = uStack_17b8;
          auVar12._0_8_ = local_17c0;
          auVar12._16_8_ = uStack_17b0;
          auVar12._24_8_ = uStack_17a8;
          auVar63 = vpaddw_avx2(auVar65,auVar12);
          local_2460 = auVar63._0_8_;
          uStack_2458 = auVar63._8_8_;
          uStack_2450 = auVar63._16_8_;
          uStack_2448 = auVar63._24_8_;
          local_a60 = local_2460;
          uStack_a58 = uStack_2458;
          uStack_a50 = uStack_2450;
          uStack_a48 = uStack_2448;
          local_a80 = local_1840;
          uStack_a78 = uStack_1838;
          uStack_a70 = uStack_1830;
          uStack_a68 = uStack_1828;
          auVar32._8_8_ = uStack_1838;
          auVar32._0_8_ = local_1840;
          auVar32._16_8_ = uStack_1830;
          auVar32._24_8_ = uStack_1828;
          auVar65 = vpunpcklwd_avx2(auVar63,auVar32);
          local_2480 = auVar65._0_8_;
          uStack_2478 = auVar65._8_8_;
          uStack_2470 = auVar65._16_8_;
          uStack_2468 = auVar65._24_8_;
          local_920 = local_2480;
          uStack_918 = uStack_2478;
          uStack_910 = uStack_2470;
          uStack_908 = uStack_2468;
          local_924 = local_16d0;
          auVar65 = vpslld_avx2(auVar65,ZEXT416(local_16d0));
          local_24a0 = auVar65._0_8_;
          uStack_2498 = auVar65._8_8_;
          uStack_2490 = auVar65._16_8_;
          uStack_2488 = auVar65._24_8_;
          local_520 = local_24a0;
          uStack_518 = uStack_2498;
          uStack_510 = uStack_2490;
          uStack_508 = uStack_2488;
          local_540 = local_1700;
          uStack_538 = uStack_16f8;
          uStack_530 = uStack_16f0;
          uStack_528 = uStack_16e8;
          auVar45._8_8_ = uStack_16f8;
          auVar45._0_8_ = local_1700;
          auVar45._16_8_ = uStack_16f0;
          auVar45._24_8_ = uStack_16e8;
          local_720 = vpaddd_avx2(auVar65,auVar45);
          local_730 = local_1710;
          uStack_728 = uStack_1708;
          auVar37._8_8_ = uStack_1708;
          auVar37._0_8_ = local_1710;
          auVar65 = vpsrad_avx2(local_720,auVar37);
          local_360 = local_2460;
          uStack_358 = uStack_2458;
          uStack_350 = uStack_2450;
          uStack_348 = uStack_2448;
          local_380 = local_1840;
          uStack_378 = uStack_1838;
          uStack_370 = uStack_1830;
          uStack_368 = uStack_1828;
          auVar52._8_8_ = uStack_1838;
          auVar52._0_8_ = local_1840;
          auVar52._16_8_ = uStack_1830;
          auVar52._24_8_ = uStack_1828;
          auVar63 = vpunpckhwd_avx2(auVar63,auVar52);
          local_24e0 = auVar63._0_8_;
          uStack_24d8 = auVar63._8_8_;
          uStack_24d0 = auVar63._16_8_;
          uStack_24c8 = auVar63._24_8_;
          local_960 = local_24e0;
          uStack_958 = uStack_24d8;
          uStack_950 = uStack_24d0;
          uStack_948 = uStack_24c8;
          local_964 = local_16d0;
          auVar63 = vpslld_avx2(auVar63,ZEXT416(local_16d0));
          local_2500 = auVar63._0_8_;
          uStack_24f8 = auVar63._8_8_;
          uStack_24f0 = auVar63._16_8_;
          uStack_24e8 = auVar63._24_8_;
          local_560 = local_2500;
          uStack_558 = uStack_24f8;
          uStack_550 = uStack_24f0;
          uStack_548 = uStack_24e8;
          local_580 = local_1700;
          uStack_578 = uStack_16f8;
          uStack_570 = uStack_16f0;
          uStack_568 = uStack_16e8;
          auVar44._8_8_ = uStack_16f8;
          auVar44._0_8_ = local_1700;
          auVar44._16_8_ = uStack_16f0;
          auVar44._24_8_ = uStack_16e8;
          local_760 = vpaddd_avx2(auVar63,auVar44);
          local_770 = local_1710;
          uStack_768 = uStack_1708;
          auVar36._8_8_ = uStack_1708;
          auVar36._0_8_ = local_1710;
          auVar63 = vpsrad_avx2(local_760,auVar36);
          local_24c0 = auVar65._0_8_;
          uStack_24b8 = auVar65._8_8_;
          uStack_24b0 = auVar65._16_8_;
          uStack_24a8 = auVar65._24_8_;
          local_2520 = auVar63._0_8_;
          uStack_2518 = auVar63._8_8_;
          uStack_2510 = auVar63._16_8_;
          uStack_2508 = auVar63._24_8_;
          local_260 = local_24c0;
          uStack_258 = uStack_24b8;
          uStack_250 = uStack_24b0;
          uStack_248 = uStack_24a8;
          local_280 = local_2520;
          uStack_278 = uStack_2518;
          uStack_270 = uStack_2510;
          uStack_268 = uStack_2508;
          auVar65 = vpackssdw_avx2(auVar65,auVar63);
          local_2540 = auVar65._0_8_;
          uStack_2538 = auVar65._8_8_;
          uStack_2530 = auVar65._16_8_;
          uStack_2528 = auVar65._24_8_;
          local_1600 = local_2540;
          uStack_15f8 = uStack_2538;
          uStack_15f0 = uStack_2530;
          uStack_15e8 = uStack_2528;
          local_1620 = local_17e0;
          uStack_1618 = uStack_17d8;
          uStack_1610 = uStack_17d0;
          uStack_1608 = uStack_17c8;
          auVar63._8_8_ = uStack_17d8;
          auVar63._0_8_ = local_17e0;
          auVar63._16_8_ = uStack_17d0;
          auVar63._24_8_ = uStack_17c8;
          auVar65 = vpaddw_avx2(auVar65,auVar63);
          if (local_1744 == 0) {
            local_1300 = local_2380;
            uStack_12f8 = uStack_2378;
            uStack_12f0 = uStack_2370;
            uStack_12e8 = uStack_2368;
            local_1068 = (undefined8 *)
                         (local_16b8 + (long)(int)(local_16c4 * local_16bc + local_16c8) * 2);
            local_1080 = local_2380;
            uStack_1078 = uStack_2378;
            *local_1068 = local_2380;
            local_1068[1] = uStack_2378;
            local_1088 = (undefined8 *)
                         (local_16b8 +
                         (long)(int)(local_16c4 * local_16bc + local_16c8 + local_16bc) * 2);
            *local_1088 = local_2680;
            local_1088[1] = uStack_2678;
            local_2560 = auVar65._0_8_;
            uStack_2558 = auVar65._8_8_;
            uStack_2550 = auVar65._16_8_;
            uStack_2548 = auVar65._24_8_;
            local_1320 = local_2560;
            uStack_1318 = uStack_2558;
            uStack_1310 = uStack_2550;
            uStack_1308 = uStack_2548;
            local_10a8 = (undefined8 *)
                         (local_16b8 + 0x10 + (long)(int)(local_16c4 * local_16bc + local_16c8) * 2)
            ;
            local_10c0 = local_2560;
            uStack_10b8 = uStack_2558;
            *local_10a8 = local_2560;
            local_10a8[1] = uStack_2558;
            local_10c8 = (undefined8 *)
                         (local_16b8 +
                         (long)(int)(local_16c4 * local_16bc + local_16c8 + 8 + local_16bc) * 2);
            local_10e0 = uStack_2550;
            uStack_10d8 = uStack_2548;
            *local_10c8 = uStack_2550;
            local_10c8[1] = uStack_2548;
          }
          else {
            iVar59 = local_16c4 * local_16bc + local_16c8;
            load_line2_avx2((__m256i *)(local_16b8 + (long)iVar59 * 2),
                            (void *)(local_16b8 + (long)(int)(iVar59 + local_16bc) * 2),
                            (void *)(ulong)local_16bc);
            uVar61 = local_16c4 * local_16bc + local_16c8;
            load_line2_avx2((__m256i *)(local_16b8 + 0x10 + (long)(int)uVar61 * 2),
                            (void *)(local_16b8 + (long)(int)(local_16bc + 8 + uVar61) * 2),
                            (void *)(ulong)uVar61);
            comp_avg(data_ref_0_00,res_unsigned,wt_00,use_dist_wtd_comp_avg_00);
            comp_avg(data_ref_0_00,res_unsigned,wt_00,use_dist_wtd_comp_avg_00);
            convolve_rounding((__m256i *)CONCAT44(iVar60,uVar71),(__m256i *)CONCAT44(iVar70,uVar56),
                              in_stack_ffffffffffffd940,iVar58);
            auVar63 = auVar65;
            convolve_rounding((__m256i *)CONCAT44(iVar60,uVar71),(__m256i *)CONCAT44(iVar70,uVar56),
                              in_stack_ffffffffffffd940,iVar58);
            wt_00 = auVar65._0_8_;
            res_unsigned = auVar65._8_8_;
            data_ref_0_00 = auVar65._16_8_;
            uStack_25e8 = auVar65._24_8_;
            local_2620 = auVar63._0_8_;
            uStack_2618 = auVar63._8_8_;
            uStack_2610 = auVar63._16_8_;
            local_1400 = wt_00;
            uStack_13f8 = res_unsigned;
            uStack_13f0 = data_ref_0_00;
            uStack_13e8 = uStack_25e8;
            local_1420 = local_2620;
            uStack_1418 = uStack_2618;
            uStack_1410 = uStack_2610;
            uStack_1408 = auVar63._24_8_;
            auVar2 = vpackuswb_avx2(auVar65,auVar63);
            local_2640 = auVar2._0_8_;
            uStack_2638 = auVar2._8_8_;
            uStack_2630 = auVar2._16_8_;
            palStack_2628 = auVar2._24_8_;
            local_12e0 = local_2640;
            uStack_12d8 = uStack_2638;
            uStack_12d0 = uStack_2630;
            palStack_12c8 = palStack_2628;
            local_1028 = (undefined8 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8));
            local_1040 = local_2640;
            uStack_1038 = uStack_2638;
            *local_1028 = local_2640;
            local_1028[1] = uStack_2638;
            local_1048 = (undefined8 *)
                         (local_16a0 + (local_16c4 * local_16a4 + local_16c8 + local_16a4));
            local_1060 = uStack_2630;
            palStack_1058 = palStack_2628;
            *local_1048 = uStack_2630;
            local_1048[1] = palStack_2628;
            _local_2620 = auVar63;
            local_2600 = auVar65;
          }
        }
        local_19c0 = local_19a0;
        local_19a0 = local_1980;
        local_1980 = local_1960;
        local_1940 = local_1920;
        local_1920 = local_1900;
        local_1900 = local_18e0;
      }
    }
  }
  else {
    local_19c4 = 1;
    local_19d0 = local_1690 - local_1694;
    for (local_16c8 = 0; local_16c8 < local_16a8; local_16c8 = local_16c8 + 0x10) {
      local_19d8 = (undefined1 (*) [16])(local_19d0 + local_16c8);
      local_e08 = local_19d8;
      local_e50 = *(undefined8 *)*local_19d8;
      uStack_e48 = *(undefined8 *)(*local_19d8 + 8);
      auVar69 = ZEXT1664(*local_19d8);
      local_1b20 = ZEXT1632(*local_19d8);
      for (local_1b24 = 0; local_1b24 < 4; local_1b24 = local_1b24 + 1) {
        local_19d8 = (undefined1 (*) [16])(*local_19d8 + local_1694);
        local_e10 = local_19d8;
        uVar66 = *(undefined8 *)*local_19d8;
        uVar67 = *(undefined8 *)(*local_19d8 + 8);
        local_e60 = uVar66;
        uStack_e58 = uVar67;
        lVar57 = (long)local_1b24 * 0x20;
        *(undefined1 (*) [16])(auStack_1af0 + lVar57) = auVar69._0_16_;
        auStack_1b00[(long)local_1b24 * 4] = uVar66;
        *(undefined8 *)(auStack_1af0 + lVar57 + -8) = uVar67;
        auVar69 = ZEXT3264(*(undefined1 (*) [32])(auStack_1b00 + (long)local_1b24 * 4));
        auVar63 = vperm2i128_avx2(*(undefined1 (*) [32])(local_1b20 + (long)local_1b24 * 0x20),
                                  *(undefined1 (*) [32])(auStack_1b00 + (long)local_1b24 * 4),0x20);
        *(undefined1 (*) [32])(&local_1a80 + (long)local_1b24 * 4) = auVar63;
      }
      local_1a00 = local_1aa0;
      uStack_19f8 = uStack_1a98;
      uStack_19f0 = uStack_1a90;
      uStack_19e8 = uStack_1a88;
      local_c60 = local_1a80;
      uStack_c58 = uStack_1a78;
      uStack_c50 = uStack_1a70;
      uStack_c48 = uStack_1a68;
      local_c80 = local_1a60;
      uStack_c78 = uStack_1a58;
      uStack_c70 = uStack_1a50;
      uStack_c68 = uStack_1a48;
      auVar23._8_8_ = uStack_1a78;
      auVar23._0_8_ = local_1a80;
      auVar23._16_8_ = uStack_1a70;
      auVar23._24_8_ = uStack_1a68;
      auVar22._8_8_ = uStack_1a58;
      auVar22._0_8_ = local_1a60;
      auVar22._16_8_ = uStack_1a50;
      auVar22._24_8_ = uStack_1a48;
      local_19c0 = vpunpcklbw_avx2(auVar23,auVar22);
      local_ca0 = local_1a40;
      uStack_c98 = uStack_1a38;
      uStack_c90 = uStack_1a30;
      uStack_c88 = uStack_1a28;
      local_cc0 = local_1a20;
      uStack_cb8 = uStack_1a18;
      uStack_cb0 = uStack_1a10;
      uStack_ca8 = uStack_1a08;
      auVar21._8_8_ = uStack_1a38;
      auVar21._0_8_ = local_1a40;
      auVar21._16_8_ = uStack_1a30;
      auVar21._24_8_ = uStack_1a28;
      auVar20._8_8_ = uStack_1a18;
      auVar20._0_8_ = local_1a20;
      auVar20._16_8_ = uStack_1a10;
      auVar20._24_8_ = uStack_1a08;
      local_19a0 = vpunpcklbw_avx2(auVar21,auVar20);
      local_aa0 = local_1a80;
      uStack_a98 = uStack_1a78;
      uStack_a90 = uStack_1a70;
      uStack_a88 = uStack_1a68;
      local_ac0 = local_1a60;
      uStack_ab8 = uStack_1a58;
      uStack_ab0 = uStack_1a50;
      uStack_aa8 = uStack_1a48;
      auVar31._8_8_ = uStack_1a78;
      auVar31._0_8_ = local_1a80;
      auVar31._16_8_ = uStack_1a70;
      auVar31._24_8_ = uStack_1a68;
      auVar30._8_8_ = uStack_1a58;
      auVar30._0_8_ = local_1a60;
      auVar30._16_8_ = uStack_1a50;
      auVar30._24_8_ = uStack_1a48;
      local_1960 = vpunpckhbw_avx2(auVar31,auVar30);
      local_ae0 = local_1a40;
      uStack_ad8 = uStack_1a38;
      uStack_ad0 = uStack_1a30;
      uStack_ac8 = uStack_1a28;
      local_b00 = local_1a20;
      uStack_af8 = uStack_1a18;
      uStack_af0 = uStack_1a10;
      uStack_ae8 = uStack_1a08;
      auVar29._8_8_ = uStack_1a38;
      auVar29._0_8_ = local_1a40;
      auVar29._16_8_ = uStack_1a30;
      auVar29._24_8_ = uStack_1a28;
      auVar64._8_8_ = uStack_1a18;
      auVar64._0_8_ = local_1a20;
      auVar64._16_8_ = uStack_1a10;
      auVar64._24_8_ = uStack_1a08;
      local_1940 = vpunpckhbw_avx2(auVar29,auVar64);
      for (local_16c4 = 0; local_16c4 < local_16ac; local_16c4 = local_16c4 + 2) {
        local_19d8 = (undefined1 (*) [16])
                     (local_19d0 + ((local_16c4 + 5) * local_1694 + local_16c8));
        local_1b60 = *(undefined8 *)*local_19d8;
        uStack_1b58 = *(undefined8 *)(*local_19d8 + 8);
        auStack_1b50 = auVar64._0_16_;
        auVar9._8_8_ = uStack_19f8;
        auVar9._0_8_ = local_1a00;
        auVar9._16_8_ = uStack_19f0;
        auVar9._24_8_ = uStack_19e8;
        auVar7._16_16_ = auStack_1b50;
        auVar7._0_16_ = *local_19d8;
        local_1b80 = vperm2i128_avx2(auVar9,auVar7,0x20);
        local_e20 = (undefined1 (*) [16])(*local_19d8 + local_1694);
        local_1a00 = *(undefined8 *)*local_e20;
        uStack_19f8 = *(undefined8 *)(*local_e20 + 8);
        uStack_19f0 = auVar64._0_8_;
        uStack_19e8 = auVar64._8_8_;
        auVar8._16_16_ = auStack_1b50;
        auVar8._0_16_ = *local_19d8;
        auVar10._16_8_ = uStack_19f0;
        auVar10._0_16_ = *local_e20;
        auVar10._24_8_ = uStack_19e8;
        local_1ba0 = vperm2i128_avx2(auVar8,auVar10,0x20);
        local_ce0 = local_1b80._0_8_;
        uStack_cd8 = local_1b80._8_8_;
        uStack_cd0 = local_1b80._16_8_;
        uStack_cc8 = local_1b80._24_8_;
        local_d00 = local_1ba0._0_8_;
        uStack_cf8 = local_1ba0._8_8_;
        uStack_cf0 = local_1ba0._16_8_;
        uStack_ce8 = local_1ba0._24_8_;
        local_1980 = vpunpcklbw_avx2(local_1b80,local_1ba0);
        local_b20 = local_1b80._0_8_;
        uStack_b18 = local_1b80._8_8_;
        uStack_b10 = local_1b80._16_8_;
        uStack_b08 = local_1b80._24_8_;
        local_b40 = local_1ba0._0_8_;
        uStack_b38 = local_1ba0._8_8_;
        uStack_b30 = local_1ba0._16_8_;
        uStack_b28 = local_1ba0._24_8_;
        auVar63 = vpunpckhbw_avx2(local_1b80,local_1ba0);
        local_1920 = auVar63;
        local_e80 = local_1a00;
        uStack_e78 = uStack_19f8;
        local_e70 = local_1b60;
        uStack_e68 = uStack_1b58;
        local_e18 = local_19d8;
        convolve_lowbd_4tap(in_stack_ffffffffffffd970,(__m256i *)in_stack_ffffffffffffd968);
        local_1bc0._0_8_ = auVar63._0_8_;
        local_1bc0._8_8_ = auVar63._8_8_;
        local_1bc0._16_8_ = auVar63._16_8_;
        local_1bc0._24_8_ = auVar63._24_8_;
        local_1440 = local_1bc0._0_8_;
        uStack_1438 = local_1bc0._8_8_;
        uStack_1430 = local_1bc0._16_8_;
        uStack_1428 = local_1bc0._24_8_;
        local_1460 = local_17c0;
        uStack_1458 = uStack_17b8;
        uStack_1450 = uStack_17b0;
        uStack_1448 = uStack_17a8;
        auVar15._8_8_ = uStack_17b8;
        auVar15._0_8_ = local_17c0;
        auVar15._16_8_ = uStack_17b0;
        auVar15._24_8_ = uStack_17a8;
        local_1bc0 = vpaddw_avx2(auVar63,auVar15);
        local_9a0 = local_1bc0._0_8_;
        uStack_998 = local_1bc0._8_8_;
        uStack_990 = local_1bc0._16_8_;
        uStack_988 = local_1bc0._24_8_;
        local_9c0 = local_1840;
        uStack_9b8 = uStack_1838;
        uStack_9b0 = uStack_1830;
        uStack_9a8 = uStack_1828;
        auVar35._8_8_ = uStack_1838;
        auVar35._0_8_ = local_1840;
        auVar35._16_8_ = uStack_1830;
        auVar35._24_8_ = uStack_1828;
        local_1be0 = vpunpcklwd_avx2(local_1bc0,auVar35);
        local_7a0 = local_1be0._0_8_;
        uStack_798 = local_1be0._8_8_;
        uStack_790 = local_1be0._16_8_;
        uStack_788 = local_1be0._24_8_;
        local_7a4 = local_16d0;
        local_1c00 = vpslld_avx2(local_1be0,ZEXT416(local_16d0));
        local_3a0 = local_1c00._0_8_;
        uStack_398 = local_1c00._8_8_;
        uStack_390 = local_1c00._16_8_;
        uStack_388 = local_1c00._24_8_;
        local_3c0 = local_1700;
        uStack_3b8 = uStack_16f8;
        uStack_3b0 = uStack_16f0;
        uStack_3a8 = uStack_16e8;
        auVar51._8_8_ = uStack_16f8;
        auVar51._0_8_ = local_1700;
        auVar51._16_8_ = uStack_16f0;
        auVar51._24_8_ = uStack_16e8;
        local_5a0 = vpaddd_avx2(local_1c00,auVar51);
        local_5b0 = local_1710;
        uStack_5a8 = uStack_1708;
        auVar43._8_8_ = uStack_1708;
        auVar43._0_8_ = local_1710;
        local_1c20 = vpsrad_avx2(local_5a0,auVar43);
        local_2a0 = local_1bc0._0_8_;
        uStack_298 = local_1bc0._8_8_;
        uStack_290 = local_1bc0._16_8_;
        uStack_288 = local_1bc0._24_8_;
        local_2c0 = local_1840;
        uStack_2b8 = uStack_1838;
        uStack_2b0 = uStack_1830;
        uStack_2a8 = uStack_1828;
        auVar55._8_8_ = uStack_1838;
        auVar55._0_8_ = local_1840;
        auVar55._16_8_ = uStack_1830;
        auVar55._24_8_ = uStack_1828;
        local_1c40 = vpunpckhwd_avx2(local_1bc0,auVar55);
        local_7e0 = local_1c40._0_8_;
        uStack_7d8 = local_1c40._8_8_;
        uStack_7d0 = local_1c40._16_8_;
        uStack_7c8 = local_1c40._24_8_;
        local_7e4 = local_16d0;
        local_1c60 = vpslld_avx2(local_1c40,ZEXT416(local_16d0));
        local_3e0 = local_1c60._0_8_;
        uStack_3d8 = local_1c60._8_8_;
        uStack_3d0 = local_1c60._16_8_;
        uStack_3c8 = local_1c60._24_8_;
        local_400 = local_1700;
        uStack_3f8 = uStack_16f8;
        uStack_3f0 = uStack_16f0;
        uStack_3e8 = uStack_16e8;
        auVar50._8_8_ = uStack_16f8;
        auVar50._0_8_ = local_1700;
        auVar50._16_8_ = uStack_16f0;
        auVar50._24_8_ = uStack_16e8;
        local_5e0 = vpaddd_avx2(local_1c60,auVar50);
        local_5f0 = local_1710;
        uStack_5e8 = uStack_1708;
        auVar42._8_8_ = uStack_1708;
        auVar42._0_8_ = local_1710;
        local_1c80 = vpsrad_avx2(local_5e0,auVar42);
        local_1a0 = local_1c20._0_8_;
        uStack_198 = local_1c20._8_8_;
        uStack_190 = local_1c20._16_8_;
        uStack_188 = local_1c20._24_8_;
        local_1c0 = local_1c80._0_8_;
        uStack_1b8 = local_1c80._8_8_;
        uStack_1b0 = local_1c80._16_8_;
        uStack_1a8 = local_1c80._24_8_;
        local_1ca0 = vpackssdw_avx2(local_1c20,local_1c80);
        local_1480 = local_1ca0._0_8_;
        uStack_1478 = local_1ca0._8_8_;
        uStack_1470 = local_1ca0._16_8_;
        uStack_1468 = local_1ca0._24_8_;
        local_14a0 = local_17e0;
        uStack_1498 = uStack_17d8;
        uStack_1490 = uStack_17d0;
        uStack_1488 = uStack_17c8;
        auVar64._8_8_ = uStack_17d8;
        auVar64._0_8_ = local_17e0;
        auVar64._16_8_ = uStack_17d0;
        auVar64._24_8_ = uStack_17c8;
        auVar63 = vpaddw_avx2(local_1ca0,auVar64);
        local_1cc0 = auVar63;
        if (local_16a8 - local_16c8 < 0x10) {
          if (local_1744 == 0) {
            local_1cc0._0_8_ = auVar63._0_8_;
            local_1cc0._8_8_ = auVar63._8_8_;
            local_1cc0._16_8_ = auVar63._16_8_;
            local_1cc0._24_8_ = auVar63._24_8_;
            local_1220 = local_1cc0._0_8_;
            uStack_1218 = local_1cc0._8_8_;
            uStack_1210 = local_1cc0._16_8_;
            uStack_1208 = local_1cc0._24_8_;
            local_1d70 = local_1cc0._0_8_;
            uStack_1d68 = local_1cc0._8_8_;
            local_ef0 = (undefined8 *)
                        (local_16b8 + (long)(int)(local_16c4 * local_16bc + local_16c8) * 2);
            local_f00 = local_1cc0._0_8_;
            uStack_ef8 = local_1cc0._8_8_;
            *local_ef0 = local_1cc0._0_8_;
            local_ef0[1] = local_1cc0._8_8_;
            local_1d80 = local_1cc0._16_8_;
            uStack_1d78 = local_1cc0._24_8_;
            local_f08 = (undefined8 *)
                        (local_16b8 +
                        (long)(int)(local_16c4 * local_16bc + local_16c8 + local_16bc) * 2);
            local_f20 = local_1cc0._16_8_;
            uStack_f18 = local_1cc0._24_8_;
            *local_f08 = local_1cc0._16_8_;
            local_f08[1] = local_1cc0._24_8_;
          }
          else {
            iVar58 = local_16c4 * local_16bc + local_16c8;
            auVar64 = auVar63;
            load_line2_avx2((__m256i *)(local_16b8 + (long)iVar58 * 2),
                            (void *)(local_16b8 + (long)(int)(iVar58 + local_16bc) * 2),
                            (void *)(ulong)local_16bc);
            local_1ce0 = auVar64;
            comp_avg(data_ref_0_00,res_unsigned,wt_00,use_dist_wtd_comp_avg_00);
            local_1d00 = auVar64;
            convolve_rounding((__m256i *)CONCAT44(iVar60,uVar71),(__m256i *)CONCAT44(iVar70,uVar56),
                              in_stack_ffffffffffffd940,
                              (int)((ulong)in_stack_ffffffffffffd938 >> 0x20));
            local_1d20._0_8_ = auVar64._0_8_;
            local_1d20._8_8_ = auVar64._8_8_;
            local_1d20._16_8_ = auVar64._16_8_;
            local_1d20._24_8_ = auVar64._24_8_;
            local_1340 = local_1d20._0_8_;
            uStack_1338 = local_1d20._8_8_;
            uStack_1330 = local_1d20._16_8_;
            uStack_1328 = local_1d20._24_8_;
            local_1360 = local_1d20._0_8_;
            uStack_1358 = local_1d20._8_8_;
            uStack_1350 = local_1d20._16_8_;
            uStack_1348 = local_1d20._24_8_;
            local_1d40 = vpackuswb_avx2(auVar64,auVar64);
            local_1200 = local_1d40._0_8_;
            uStack_11f8 = local_1d40._8_8_;
            uStack_11f0 = local_1d40._16_8_;
            uStack_11e8 = local_1d40._24_8_;
            local_1d50 = local_1d40._0_8_;
            uStack_1d48 = local_1d40._8_8_;
            local_1d60 = local_1d40._16_8_;
            uStack_1d58 = local_1d40._24_8_;
            local_1d20 = auVar64;
            if (local_16a8 - local_16c8 < 5) {
              local_10f0 = local_1d40._0_8_;
              uStack_10e8 = local_1d40._8_8_;
              local_1100 = local_1d40._0_8_;
              uVar67 = local_1100;
              uStack_10f8 = local_1d40._8_8_;
              local_1100._0_4_ = local_1d40._0_4_;
              *(undefined4 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8)) =
                   (undefined4)local_1100;
              local_1110 = local_1d40._16_8_;
              uStack_1108 = local_1d40._24_8_;
              local_1120 = local_1d40._16_8_;
              uVar66 = local_1120;
              uStack_1118 = local_1d40._24_8_;
              local_1120._0_4_ = local_1d40._16_4_;
              *(undefined4 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8 + local_16a4)) =
                   (undefined4)local_1120;
              local_1120 = uVar66;
              local_1100 = uVar67;
            }
            else {
              local_1168 = (undefined8 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8));
              local_1180 = local_1d40._0_8_;
              uStack_1178 = local_1d40._8_8_;
              *local_1168 = local_1d40._0_8_;
              local_1188 = (undefined8 *)
                           (local_16a0 + (local_16c4 * local_16a4 + local_16c8 + local_16a4));
              local_11a0 = local_1d40._16_8_;
              uStack_1198 = local_1d40._24_8_;
              *local_1188 = local_1d40._16_8_;
            }
          }
        }
        else {
          convolve_lowbd_4tap(in_stack_ffffffffffffd970,(__m256i *)in_stack_ffffffffffffd968);
          local_1da0._0_8_ = auVar63._0_8_;
          local_1da0._8_8_ = auVar63._8_8_;
          local_1da0._16_8_ = auVar63._16_8_;
          local_1da0._24_8_ = auVar63._24_8_;
          local_14c0 = local_1da0._0_8_;
          uStack_14b8 = local_1da0._8_8_;
          uStack_14b0 = local_1da0._16_8_;
          uStack_14a8 = local_1da0._24_8_;
          local_14e0 = local_17c0;
          uStack_14d8 = uStack_17b8;
          uStack_14d0 = uStack_17b0;
          uStack_14c8 = uStack_17a8;
          auVar14._8_8_ = uStack_17b8;
          auVar14._0_8_ = local_17c0;
          auVar14._16_8_ = uStack_17b0;
          auVar14._24_8_ = uStack_17a8;
          local_1da0 = vpaddw_avx2(auVar63,auVar14);
          local_9e0 = local_1da0._0_8_;
          uStack_9d8 = local_1da0._8_8_;
          uStack_9d0 = local_1da0._16_8_;
          uStack_9c8 = local_1da0._24_8_;
          local_a00 = local_1840;
          uStack_9f8 = uStack_1838;
          uStack_9f0 = uStack_1830;
          uStack_9e8 = uStack_1828;
          auVar34._8_8_ = uStack_1838;
          auVar34._0_8_ = local_1840;
          auVar34._16_8_ = uStack_1830;
          auVar34._24_8_ = uStack_1828;
          local_1dc0 = vpunpcklwd_avx2(local_1da0,auVar34);
          local_820 = local_1dc0._0_8_;
          uStack_818 = local_1dc0._8_8_;
          uStack_810 = local_1dc0._16_8_;
          uStack_808 = local_1dc0._24_8_;
          local_824 = local_16d0;
          local_1de0 = vpslld_avx2(local_1dc0,ZEXT416(local_16d0));
          local_420 = local_1de0._0_8_;
          uStack_418 = local_1de0._8_8_;
          uStack_410 = local_1de0._16_8_;
          uStack_408 = local_1de0._24_8_;
          local_440 = local_1700;
          uStack_438 = uStack_16f8;
          uStack_430 = uStack_16f0;
          uStack_428 = uStack_16e8;
          auVar49._8_8_ = uStack_16f8;
          auVar49._0_8_ = local_1700;
          auVar49._16_8_ = uStack_16f0;
          auVar49._24_8_ = uStack_16e8;
          local_620 = vpaddd_avx2(local_1de0,auVar49);
          local_630 = local_1710;
          uStack_628 = uStack_1708;
          auVar41._8_8_ = uStack_1708;
          auVar41._0_8_ = local_1710;
          local_1e00 = vpsrad_avx2(local_620,auVar41);
          local_2e0 = local_1da0._0_8_;
          uStack_2d8 = local_1da0._8_8_;
          uStack_2d0 = local_1da0._16_8_;
          uStack_2c8 = local_1da0._24_8_;
          local_300 = local_1840;
          uStack_2f8 = uStack_1838;
          uStack_2f0 = uStack_1830;
          uStack_2e8 = uStack_1828;
          auVar54._8_8_ = uStack_1838;
          auVar54._0_8_ = local_1840;
          auVar54._16_8_ = uStack_1830;
          auVar54._24_8_ = uStack_1828;
          local_1e20 = vpunpckhwd_avx2(local_1da0,auVar54);
          local_860 = local_1e20._0_8_;
          uStack_858 = local_1e20._8_8_;
          uStack_850 = local_1e20._16_8_;
          uStack_848 = local_1e20._24_8_;
          local_864 = local_16d0;
          local_1e40 = vpslld_avx2(local_1e20,ZEXT416(local_16d0));
          local_460 = local_1e40._0_8_;
          uStack_458 = local_1e40._8_8_;
          uStack_450 = local_1e40._16_8_;
          uStack_448 = local_1e40._24_8_;
          local_480 = local_1700;
          uStack_478 = uStack_16f8;
          uStack_470 = uStack_16f0;
          uStack_468 = uStack_16e8;
          auVar48._8_8_ = uStack_16f8;
          auVar48._0_8_ = local_1700;
          auVar48._16_8_ = uStack_16f0;
          auVar48._24_8_ = uStack_16e8;
          local_660 = vpaddd_avx2(local_1e40,auVar48);
          local_670 = local_1710;
          uStack_668 = uStack_1708;
          auVar40._8_8_ = uStack_1708;
          auVar40._0_8_ = local_1710;
          local_1e60 = vpsrad_avx2(local_660,auVar40);
          local_1e0 = local_1e00._0_8_;
          uStack_1d8 = local_1e00._8_8_;
          uStack_1d0 = local_1e00._16_8_;
          uStack_1c8 = local_1e00._24_8_;
          local_200 = local_1e60._0_8_;
          uStack_1f8 = local_1e60._8_8_;
          uStack_1f0 = local_1e60._16_8_;
          uStack_1e8 = local_1e60._24_8_;
          local_1e80 = vpackssdw_avx2(local_1e00,local_1e60);
          local_1500 = local_1e80._0_8_;
          uStack_14f8 = local_1e80._8_8_;
          uStack_14f0 = local_1e80._16_8_;
          uStack_14e8 = local_1e80._24_8_;
          local_1520 = local_17e0;
          uStack_1518 = uStack_17d8;
          uStack_1510 = uStack_17d0;
          uStack_1508 = uStack_17c8;
          auVar64._8_8_ = uStack_17d8;
          auVar64._0_8_ = local_17e0;
          auVar64._16_8_ = uStack_17d0;
          auVar64._24_8_ = uStack_17c8;
          local_1ea0 = vpaddw_avx2(local_1e80,auVar64);
          if (local_1744 == 0) {
            local_1260 = local_1cc0._0_8_;
            uStack_1258 = local_1cc0._8_8_;
            uStack_1250 = local_1cc0._16_8_;
            uStack_1248 = local_1cc0._24_8_;
            local_f68 = (undefined8 *)
                        (local_16b8 + (long)(int)(local_16c4 * local_16bc + local_16c8) * 2);
            local_f80 = local_1cc0._0_8_;
            uStack_f78 = local_1cc0._8_8_;
            *local_f68 = local_1cc0._0_8_;
            local_f68[1] = local_1cc0._8_8_;
            uStack_1fa8 = local_1cc0._24_8_;
            local_1fb0 = local_1cc0._16_8_;
            local_f88 = (undefined8 *)
                        (local_16b8 +
                        (long)(int)(local_16c4 * local_16bc + local_16c8 + local_16bc) * 2);
            local_fa0 = local_1fc0;
            uStack_f98 = uStack_1fb8;
            *local_f88 = local_1fc0;
            local_f88[1] = uStack_1fb8;
            local_1280 = local_1ea0._0_8_;
            uStack_1278 = local_1ea0._8_8_;
            uStack_1270 = local_1ea0._16_8_;
            uStack_1268 = local_1ea0._24_8_;
            local_1fd0 = local_1ea0._0_8_;
            uStack_1fc8 = local_1ea0._8_8_;
            local_fa8 = (undefined8 *)
                        (local_16b8 + 0x10 + (long)(int)(local_16c4 * local_16bc + local_16c8) * 2);
            local_fc0 = local_1ea0._0_8_;
            uStack_fb8 = local_1ea0._8_8_;
            *local_fa8 = local_1ea0._0_8_;
            local_fa8[1] = local_1ea0._8_8_;
            local_1fe0 = local_1ea0._16_8_;
            uStack_1fd8 = local_1ea0._24_8_;
            local_fc8 = (undefined8 *)
                        (local_16b8 +
                        (long)(int)(local_16c4 * local_16bc + local_16c8 + 8 + local_16bc) * 2);
            local_fe0 = local_1ea0._16_8_;
            uStack_fd8 = local_1ea0._24_8_;
            *local_fc8 = local_1ea0._16_8_;
            local_fc8[1] = local_1ea0._24_8_;
          }
          else {
            iVar58 = local_16c4 * local_16bc + local_16c8;
            auVar64 = local_1ea0;
            load_line2_avx2((__m256i *)(local_16b8 + (long)iVar58 * 2),
                            (void *)(local_16b8 + (long)(int)(iVar58 + local_16bc) * 2),
                            (void *)(ulong)local_16bc);
            uVar61 = local_16c4 * local_16bc + local_16c8;
            local_1ec0 = auVar64;
            load_line2_avx2((__m256i *)(local_16b8 + 0x10 + (long)(int)uVar61 * 2),
                            (void *)(local_16b8 + (long)(int)(local_16bc + 8 + uVar61) * 2),
                            (void *)(ulong)uVar61);
            local_1ee0 = auVar64;
            comp_avg(data_ref_0_00,res_unsigned,wt_00,use_dist_wtd_comp_avg_00);
            local_1f00 = auVar64;
            comp_avg(data_ref_0_00,res_unsigned,wt_00,use_dist_wtd_comp_avg_00);
            in_stack_ffffffffffffd938 = &local_1780;
            in_stack_ffffffffffffd940 = (__m256i *)&local_1820;
            iVar58 = (int)((ulong)in_stack_ffffffffffffd938 >> 0x20);
            local_1f20 = auVar64;
            convolve_rounding((__m256i *)CONCAT44(iVar60,uVar71),(__m256i *)CONCAT44(iVar70,uVar56),
                              in_stack_ffffffffffffd940,iVar58);
            local_1f40 = auVar64;
            convolve_rounding((__m256i *)CONCAT44(iVar60,uVar71),(__m256i *)CONCAT44(iVar70,uVar56),
                              in_stack_ffffffffffffd940,iVar58);
            local_1f60._0_8_ = auVar64._0_8_;
            local_1f60._8_8_ = auVar64._8_8_;
            local_1f60._16_8_ = auVar64._16_8_;
            local_1f60._24_8_ = auVar64._24_8_;
            local_1380 = local_1f40._0_8_;
            uStack_1378 = local_1f40._8_8_;
            uStack_1370 = local_1f40._16_8_;
            uStack_1368 = local_1f40._24_8_;
            local_13a0 = local_1f60._0_8_;
            uStack_1398 = local_1f60._8_8_;
            uStack_1390 = local_1f60._16_8_;
            uStack_1388 = local_1f60._24_8_;
            local_1f80 = vpackuswb_avx2(local_1f40,auVar64);
            local_1240 = local_1f80._0_8_;
            uStack_1238 = local_1f80._8_8_;
            uStack_1230 = local_1f80._16_8_;
            uStack_1228 = local_1f80._24_8_;
            local_1f90 = local_1f80._0_8_;
            uStack_1f88 = local_1f80._8_8_;
            local_1fa0 = local_1f80._16_8_;
            uStack_1f98 = local_1f80._24_8_;
            local_f28 = (undefined8 *)(local_16a0 + (local_16c4 * local_16a4 + local_16c8));
            local_f40 = local_1f80._0_8_;
            uStack_f38 = local_1f80._8_8_;
            *local_f28 = local_1f80._0_8_;
            local_f28[1] = local_1f80._8_8_;
            local_f48 = (undefined8 *)
                        (local_16a0 + (local_16c4 * local_16a4 + local_16c8 + local_16a4));
            local_f60 = local_1f80._16_8_;
            uStack_f58 = local_1f80._24_8_;
            *local_f48 = local_1f80._16_8_;
            local_f48[1] = local_1f80._24_8_;
            local_1f60 = auVar64;
          }
        }
        local_19c0 = local_19a0;
        local_19a0 = local_1980;
        local_1960 = local_1940;
        local_1940 = local_1920;
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_avx2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;
  int i, j, is_vert_4tap = 0;
  // +1 to compensate for dividing the filter coeffs by 2
  const int left_shift = FILTER_BITS - conv_params->round_0 + 1;
  const __m256i round_const =
      _mm256_set1_epi32((1 << conv_params->round_1) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int offset_1 = (1 << (bd + FILTER_BITS - 2));
  const __m256i offset_const_1 = _mm256_set1_epi16(offset_1);
  const __m256i offset_const_2 = _mm256_set1_epi16((1 << offset_0));
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);
  const __m256i zero = _mm256_setzero_si256();
  __m256i coeffs[4], s[8];

  assert((FILTER_BITS - conv_params->round_0) >= 0);

  prepare_coeffs_lowbd(filter_params_y, subpel_y_qn, coeffs);

  // Condition for checking valid vert_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs[0], coeffs[3]), 0)))
    is_vert_4tap = 1;

  if (is_vert_4tap) {
    const int fo_vert = 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride;
    for (j = 0; j < w; j += 16) {
      const uint8_t *data = &src_ptr[j];
      __m256i src4;
      // Load lines a and b. Line a to lower 128, line b to upper 128
      {
        __m256i src_ab[4];
        __m256i src_a[5];
        src_a[0] = _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        for (int kk = 0; kk < 4; ++kk) {
          data += src_stride;
          src_a[kk + 1] =
              _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
          src_ab[kk] =
              _mm256_permute2x128_si256(src_a[kk], src_a[kk + 1], 0x20);
        }
        src4 = src_a[4];
        s[0] = _mm256_unpacklo_epi8(src_ab[0], src_ab[1]);
        s[1] = _mm256_unpacklo_epi8(src_ab[2], src_ab[3]);

        s[3] = _mm256_unpackhi_epi8(src_ab[0], src_ab[1]);
        s[4] = _mm256_unpackhi_epi8(src_ab[2], src_ab[3]);
      }

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[(i + 5) * src_stride + j];
        const __m256i src5 =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        const __m256i src_45a = _mm256_permute2x128_si256(src4, src5, 0x20);

        src4 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + src_stride)));
        const __m256i src_56a = _mm256_permute2x128_si256(src5, src4, 0x20);

        s[2] = _mm256_unpacklo_epi8(src_45a, src_56a);
        s[5] = _mm256_unpackhi_epi8(src_45a, src_56a);

        __m256i res_lo = convolve_lowbd_4tap(s, coeffs + 1);

        res_lo = _mm256_add_epi16(res_lo, offset_const_1);

        const __m256i res_lo_0_32b = _mm256_unpacklo_epi16(res_lo, zero);
        const __m256i res_lo_0_shift =
            _mm256_slli_epi32(res_lo_0_32b, left_shift);
        const __m256i res_lo_0_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_0_shift, round_const), round_shift);

        const __m256i res_lo_1_32b = _mm256_unpackhi_epi16(res_lo, zero);
        const __m256i res_lo_1_shift =
            _mm256_slli_epi32(res_lo_1_32b, left_shift);
        const __m256i res_lo_1_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_1_shift, round_const), round_shift);

        const __m256i res_lo_round =
            _mm256_packs_epi32(res_lo_0_round, res_lo_1_round);

        const __m256i res_lo_unsigned =
            _mm256_add_epi16(res_lo_round, offset_const_2);

        if (w - j < 16) {
          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_lo_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            if (w - j > 4) {
              _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
              _mm_storel_epi64(
                  (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])),
                  res_1);
            } else {
              *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
              *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                  _mm_cvtsi128_si32(res_1);
            }
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          __m256i res_hi = convolve_lowbd_4tap(s + 3, coeffs + 1);

          res_hi = _mm256_add_epi16(res_hi, offset_const_1);

          const __m256i res_hi_0_32b = _mm256_unpacklo_epi16(res_hi, zero);
          const __m256i res_hi_0_shift =
              _mm256_slli_epi32(res_hi_0_32b, left_shift);
          const __m256i res_hi_0_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_0_shift, round_const), round_shift);

          const __m256i res_hi_1_32b = _mm256_unpackhi_epi16(res_hi, zero);
          const __m256i res_hi_1_shift =
              _mm256_slli_epi32(res_hi_1_32b, left_shift);
          const __m256i res_hi_1_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_1_shift, round_const), round_shift);

          const __m256i res_hi_round =
              _mm256_packs_epi32(res_hi_0_round, res_hi_1_round);

          const __m256i res_hi_unsigned =
              _mm256_add_epi16(res_hi_round, offset_const_2);

          if (do_average) {
            const __m256i data_ref_0_lo =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i data_ref_0_hi =
                load_line2_avx2(&dst[i * dst_stride + j + 8],
                                &dst[i * dst_stride + j + 8 + dst_stride]);

            const __m256i comp_avg_res_lo = comp_avg(
                &data_ref_0_lo, &res_lo_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i comp_avg_res_hi = comp_avg(
                &data_ref_0_hi, &res_hi_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                convolve_rounding(&comp_avg_res_lo, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i round_result_hi =
                convolve_rounding(&comp_avg_res_hi, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result_lo, round_result_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);

          } else {
            const __m128i res_lo_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_lo_0);

            const __m128i res_lo_1 =
                _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_lo_1);

            const __m128i res_hi_0 = _mm256_castsi256_si128(res_hi_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + 8]),
                            res_hi_0);

            const __m128i res_hi_1 =
                _mm256_extracti128_si256(res_hi_unsigned, 1);
            _mm_store_si128(
                (__m128i *)(&dst[i * dst_stride + j + 8 + dst_stride]),
                res_hi_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];

        s[3] = s[4];
        s[4] = s[5];
      }
    }
  } else {
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride;
    for (j = 0; j < w; j += 16) {
      const uint8_t *data = &src_ptr[j];
      __m256i src6;
      // Load lines a and b. Line a to lower 128, line b to upper 128
      {
        __m256i src_ab[7];
        __m256i src_a[7];
        src_a[0] = _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        for (int kk = 0; kk < 6; ++kk) {
          data += src_stride;
          src_a[kk + 1] =
              _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
          src_ab[kk] =
              _mm256_permute2x128_si256(src_a[kk], src_a[kk + 1], 0x20);
        }
        src6 = src_a[6];
        s[0] = _mm256_unpacklo_epi8(src_ab[0], src_ab[1]);
        s[1] = _mm256_unpacklo_epi8(src_ab[2], src_ab[3]);
        s[2] = _mm256_unpacklo_epi8(src_ab[4], src_ab[5]);
        s[4] = _mm256_unpackhi_epi8(src_ab[0], src_ab[1]);
        s[5] = _mm256_unpackhi_epi8(src_ab[2], src_ab[3]);
        s[6] = _mm256_unpackhi_epi8(src_ab[4], src_ab[5]);
      }

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[(i + 7) * src_stride + j];
        const __m256i src7 =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        const __m256i src_67a = _mm256_permute2x128_si256(src6, src7, 0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + src_stride)));
        const __m256i src_78a = _mm256_permute2x128_si256(src7, src6, 0x20);

        s[3] = _mm256_unpacklo_epi8(src_67a, src_78a);
        s[7] = _mm256_unpackhi_epi8(src_67a, src_78a);

        __m256i res_lo = convolve_lowbd(s, coeffs);

        res_lo = _mm256_add_epi16(res_lo, offset_const_1);

        const __m256i res_lo_0_32b = _mm256_unpacklo_epi16(res_lo, zero);
        const __m256i res_lo_0_shift =
            _mm256_slli_epi32(res_lo_0_32b, left_shift);
        const __m256i res_lo_0_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_0_shift, round_const), round_shift);

        const __m256i res_lo_1_32b = _mm256_unpackhi_epi16(res_lo, zero);
        const __m256i res_lo_1_shift =
            _mm256_slli_epi32(res_lo_1_32b, left_shift);
        const __m256i res_lo_1_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_1_shift, round_const), round_shift);

        const __m256i res_lo_round =
            _mm256_packs_epi32(res_lo_0_round, res_lo_1_round);

        const __m256i res_lo_unsigned =
            _mm256_add_epi16(res_lo_round, offset_const_2);

        if (w - j < 16) {
          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_lo_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            if (w - j > 4) {
              _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
              _mm_storel_epi64(
                  (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])),
                  res_1);
            } else {
              *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
              *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                  _mm_cvtsi128_si32(res_1);
            }
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          __m256i res_hi = convolve_lowbd(s + 4, coeffs);

          res_hi = _mm256_add_epi16(res_hi, offset_const_1);

          const __m256i res_hi_0_32b = _mm256_unpacklo_epi16(res_hi, zero);
          const __m256i res_hi_0_shift =
              _mm256_slli_epi32(res_hi_0_32b, left_shift);
          const __m256i res_hi_0_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_0_shift, round_const), round_shift);

          const __m256i res_hi_1_32b = _mm256_unpackhi_epi16(res_hi, zero);
          const __m256i res_hi_1_shift =
              _mm256_slli_epi32(res_hi_1_32b, left_shift);
          const __m256i res_hi_1_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_1_shift, round_const), round_shift);

          const __m256i res_hi_round =
              _mm256_packs_epi32(res_hi_0_round, res_hi_1_round);

          const __m256i res_hi_unsigned =
              _mm256_add_epi16(res_hi_round, offset_const_2);

          if (do_average) {
            const __m256i data_ref_0_lo =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i data_ref_0_hi =
                load_line2_avx2(&dst[i * dst_stride + j + 8],
                                &dst[i * dst_stride + j + 8 + dst_stride]);

            const __m256i comp_avg_res_lo = comp_avg(
                &data_ref_0_lo, &res_lo_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i comp_avg_res_hi = comp_avg(
                &data_ref_0_hi, &res_hi_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                convolve_rounding(&comp_avg_res_lo, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i round_result_hi =
                convolve_rounding(&comp_avg_res_hi, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result_lo, round_result_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);

          } else {
            const __m128i res_lo_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_lo_0);

            const __m128i res_lo_1 =
                _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_lo_1);

            const __m128i res_hi_0 = _mm256_castsi256_si128(res_hi_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + 8]),
                            res_hi_0);

            const __m128i res_hi_1 =
                _mm256_extracti128_si256(res_hi_unsigned, 1);
            _mm_store_si128(
                (__m128i *)(&dst[i * dst_stride + j + 8 + dst_stride]),
                res_hi_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}